

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XarHelpers.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
tools::xar::(anonymous_namespace)::read_file_prefix_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,char *filename,size_t max_bytes)

{
  undefined4 __fd;
  int iVar1;
  void *__buf;
  size_t __nbytes;
  ssize_t sVar2;
  ssize_t res;
  undefined1 local_48 [8];
  string buf;
  int fd;
  size_t max_bytes_local;
  char *filename_local;
  
  buf.field_2._12_4_ = open((char *)this,0x80000);
  if ((int)buf.field_2._12_4_ < 0) {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional(__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::string((string *)local_48);
    std::__cxx11::string::resize((ulong)local_48);
    __fd = buf.field_2._12_4_;
    __buf = (void *)std::__cxx11::string::operator[]((ulong)local_48);
    __nbytes = std::__cxx11::string::size();
    sVar2 = read(__fd,__buf,__nbytes);
    if (sVar2 < 0) {
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional(__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::resize((ulong)local_48);
      iVar1 = close(buf.field_2._12_4_);
      if (iVar1 < 0) {
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional(__return_storage_ptr__);
      }
      else {
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
      }
    }
    std::__cxx11::string::~string((string *)local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> read_file_prefix(
    const char* filename,
    size_t max_bytes) {
  int fd = open(filename, O_RDONLY | O_CLOEXEC);
  if (fd < 0) {
    return std::nullopt;
  }

  std::string buf;
  buf.resize(max_bytes);
  ssize_t res = read(fd, &buf[0], buf.size());
  if (res < 0) {
    return std::nullopt;
  }
  buf.resize(res);
  res = close(fd);
  if (res < 0) {
    return std::nullopt;
  }

  return buf;
}